

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Graph::prohibitTransition(Graph *this,int left,int mid,int right)

{
  Edge *this_00;
  Edge *pEVar1;
  bool bVar2;
  reference ppEVar3;
  iterator __first;
  iterator __last;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
  *in_RDI;
  Edge *edge;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  Edge *rightEdge;
  Edge *leftEdge;
  vector<Edge_*,_std::allocator<Edge_*>_> *in_stack_ffffffffffffff58;
  vector<Edge_*,_std::allocator<Edge_*>_> *this_01;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
  *in_stack_ffffffffffffff60;
  vector<Edge_*,_std::allocator<Edge_*>_> *this_02;
  Edge **in_stack_ffffffffffffff68;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
  in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff78;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_38;
  reference local_30;
  Edge *local_28;
  Edge *local_20;
  int local_14;
  int local_c;
  
  local_14 = in_ECX;
  local_c = in_ESI;
  local_30 = std::
             vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ::operator[](in_RDI,(long)in_EDX);
  local_38._M_current =
       (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(in_stack_ffffffffffffff58);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::end(in_stack_ffffffffffffff58);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                             *)in_stack_ffffffffffffff58), bVar2) {
    ppEVar3 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_38);
    this_00 = *ppEVar3;
    bVar2 = Edge::connectsTo(this_00,local_c);
    pEVar1 = this_00;
    if (!bVar2) {
      pEVar1 = local_20;
    }
    local_20 = pEVar1;
    bVar2 = Edge::connectsTo(this_00,local_14);
    if (!bVar2) {
      this_00 = local_28;
    }
    local_28 = this_00;
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator++
              (&local_38);
  }
  this_01 = &local_20->neighbours;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(this_01);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::end(this_01);
  std::find<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,Edge*>
            ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             in_stack_ffffffffffffff78._M_current,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<Edge*const*,std::vector<Edge*,std::allocator<Edge*>>>::
  __normal_iterator<Edge**>
            (in_stack_ffffffffffffff60,
             (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)this_01);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::erase
            ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_stack_ffffffffffffff70._M_current,
             in_stack_ffffffffffffff78);
  this_02 = &local_28->neighbours;
  __first = std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(this_01);
  __last = std::vector<Edge_*,_std::allocator<Edge_*>_>::end(this_01);
  std::find<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,Edge*>
            ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             __first._M_current,
             (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             __last._M_current,in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<Edge*const*,std::vector<Edge*,std::allocator<Edge*>>>::
  __normal_iterator<Edge**>
            ((__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
             this_02,(__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                     this_01);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::erase
            ((vector<Edge_*,_std::allocator<Edge_*>_> *)__last._M_current,
             (const_iterator)__first._M_current);
  return;
}

Assistant:

void Graph::prohibitTransition(int left, int mid, int right) {
  Edge* leftEdge;
  Edge* rightEdge;
  for(Edge* edge: adjList[mid]) {
    if(edge->connectsTo(left)) leftEdge = edge;
    if(edge->connectsTo(right)) rightEdge = edge;
  }
  leftEdge->neighbours.erase(std::find(leftEdge->neighbours.begin(), leftEdge->neighbours.end(), rightEdge));
  rightEdge->neighbours.erase(std::find(rightEdge->neighbours.begin(), rightEdge->neighbours.end(), leftEdge));
}